

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O1

void __thiscall
CMethod::CMethod(CMethod *this,CType *_returnType,IExpression *_returnExp,CIdExp *_name,
                CArgumentList *_arguments,CFieldList *_vars,CCompoundStm *_statements,bool _isPublic
                )

{
  IExpression *pIVar1;
  CIdExp *pCVar2;
  CArgumentList *pCVar3;
  CCompoundStm *pCVar4;
  CFieldList *pCVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  (this->super_IWrapper).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00181f08;
  (this->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
  super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.super__Head_base<0UL,_CType_*,_false>
  ._M_head_impl = (CType *)0x0;
  (this->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = (IExpression *)0x0;
  (this->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = (CIdExp *)0x0;
  (this->arguments)._M_t.super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>.
  _M_t.super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
  super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl = (CArgumentList *)0x0;
  (this->statements)._M_t.super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>.
  _M_t.super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
  super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl = (CCompoundStm *)0x0;
  (this->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
  super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
  super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl = (CFieldList *)0x0;
  (this->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>._M_t.
  super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.super__Head_base<0UL,_CType_*,_false>
  ._M_head_impl = _returnType;
  pIVar1 = (this->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (this->returnExp)._M_t.super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
  super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
  super__Head_base<0UL,_IExpression_*,_false>._M_head_impl = _returnExp;
  if (pIVar1 != (IExpression *)0x0) {
    (**(code **)(*(long *)&(pIVar1->super_PositionedNode).super_INode + 0x10))();
  }
  pCVar2 = (this->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (this->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
  super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
  super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl = _name;
  if (pCVar2 != (CIdExp *)0x0) {
    (**(code **)(*(long *)&(pCVar2->super_IExpression).super_PositionedNode + 0x10))();
  }
  pCVar3 = (this->arguments)._M_t.
           super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
           super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
           super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  (this->arguments)._M_t.super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>.
  _M_t.super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
  super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl = _arguments;
  if (pCVar3 != (CArgumentList *)0x0) {
    (**(code **)(*(long *)&(pCVar3->super_IWrapper).super_PositionedNode + 0x10))();
  }
  pCVar4 = (this->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (this->statements)._M_t.super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>.
  _M_t.super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
  super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl = _statements;
  if (pCVar4 != (CCompoundStm *)0x0) {
    (**(code **)(*(long *)&(pCVar4->super_IStatement).super_PositionedNode + 0x10))();
  }
  pCVar5 = (this->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  (this->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
  super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
  super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl = _vars;
  if (pCVar5 != (CFieldList *)0x0) {
    (**(code **)(*(long *)&(pCVar5->super_IWrapper).super_PositionedNode + 0x10))();
  }
  this->isPublic = _isPublic;
  iVar6 = (_name->super_IExpression).super_PositionedNode.position.lastLine;
  iVar7 = (_name->super_IExpression).super_PositionedNode.position.firstColumn;
  iVar8 = (_name->super_IExpression).super_PositionedNode.position.lastColumn;
  (this->super_IWrapper).super_PositionedNode.position.firstLine =
       (_name->super_IExpression).super_PositionedNode.position.firstLine;
  (this->super_IWrapper).super_PositionedNode.position.lastLine = iVar6;
  (this->super_IWrapper).super_PositionedNode.position.firstColumn = iVar7;
  (this->super_IWrapper).super_PositionedNode.position.lastColumn = iVar8;
  return;
}

Assistant:

CMethod::CMethod(CType* _returnType, IExpression* _returnExp, CIdExp* _name, CArgumentList* _arguments, CFieldList* _vars, CCompoundStm* _statements, bool _isPublic)
{
	returnType = std::unique_ptr<CType>(_returnType);
	returnExp = std::unique_ptr<IExpression>(_returnExp);
	name = std::unique_ptr<CIdExp>(_name);
	arguments = std::unique_ptr<CArgumentList>(_arguments);
	statements = std::unique_ptr<CCompoundStm>(_statements);
	vars = std::unique_ptr<CFieldList>(_vars);
	isPublic = _isPublic;
    position = _name->position;
}